

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O2

void __thiscall
m2d::savanna::ssl_reuse::
https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::error_callback(https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
                 *this,error_code ec)

{
  delegate<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *pdVar1;
  system_error sStack_148;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_108;
  
  pdVar1 = this->delegate_;
  if (pdVar1 != (delegate<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
                 *)0x0) {
    boost::system::system_error::system_error(&sStack_148,ec);
    result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
    ::result(&local_108,&sStack_148);
    (**pdVar1->_vptr_delegate)(pdVar1,&local_108);
    result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
    ::~result(&local_108);
    boost::system::system_error::~system_error(&sStack_148);
  }
  return;
}

Assistant:

void error_callback(beast::error_code ec) override {
			if(delegate_) delegate_->completion_callback(savanna::result<http::response<Body>>(beast::system_error { ec }));
		}